

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redirectfree.h
# Opt level: O0

void Hoard::
     RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
     ::free(void *__ptr)

{
  SmallHeap *pSVar1;
  SmallHeap *pSVar2;
  baseHeapType owner;
  SuperblockType *s;
  
  BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  ::getSuperblock((void *)0x118983);
  HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>::lock
            ((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
              *)0x118992);
  while( true ) {
    pSVar1 = HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
             ::getOwner((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                         *)0x11899c);
    (*(pSVar1->
      super_ConformantHeap<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>_>
      ).
      super_HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
      .
      super_BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
      ._vptr_BaseHoardManager[1])();
    pSVar2 = HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
             ::getOwner((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                         *)0x1189c0);
    if (pSVar1 == pSVar2) break;
    (*(pSVar1->
      super_ConformantHeap<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>_>
      ).
      super_HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
      .
      super_BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
      ._vptr_BaseHoardManager[2])();
    HL::Fred::yield();
  }
  (**(pSVar1->
     super_ConformantHeap<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>_>
     ).
     super_HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
     .
     super_BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
     ._vptr_BaseHoardManager)(pSVar1,__ptr);
  (*(pSVar1->
    super_ConformantHeap<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>_>
    ).
    super_HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
    .
    super_BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
    ._vptr_BaseHoardManager[2])();
  HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>::unlock
            ((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
              *)0x1189f1);
  return;
}

Assistant:

static inline void free (void * ptr) {
      // Get the superblock header.
      SuperblockType * s = reinterpret_cast<SuperblockType *>(Heap::getSuperblock (ptr));

      assert (s->isValidSuperblock());

      // Find out who the owner is.

      typedef BaseHoardManager<SuperblockType> * baseHeapType;
      baseHeapType owner;

      s->lock();

      // By acquiring the lock on the superblock (above),
      // we prevent it from moving up to a higher heap.
      // This eventually pins it down in one heap,
      // so this loop is guaranteed to terminate.
      // (It should generally take no more than two iterations.)

      for (;;) {
	owner = reinterpret_cast<baseHeapType>(s->getOwner());
	assert (owner != nullptr);
	assert (owner->isValid());
	// Lock the owner. If ownership changed between these two lines,
	// we'll detect it and try again.
	owner->lock();
	if (owner == reinterpret_cast<baseHeapType>(s->getOwner())) {
	  owner->free (ptr);
	  owner->unlock();
	  s->unlock();
	  return;
	}
	owner->unlock();

	// Sleep a little.
	HL::Fred::yield();
      }
    }